

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application_glfw.cpp
# Opt level: O3

void __thiscall Application::createWindow(Application *this,string *windowName,int width,int height)

{
  int iVar1;
  undefined8 in_RAX;
  GLFWwindow *handle;
  Application *this_00;
  int height_00;
  int width_00;
  GLFWwindow *handle_00;
  int local_24 [2];
  int frameBufferWidth;
  
  local_24[0] = (int)((ulong)in_RAX >> 0x20);
  width_00 = (int)windowName;
  handle_00 = (GLFWwindow *)&this->_windowName;
  std::__cxx11::string::_M_assign((string *)handle_00);
  this->_windowWidth = width;
  this->_windowHeight = height;
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    createWindow();
  }
  else {
    glfwWindowHint(0x21005,0x10);
    glfwWindowHint(0x2000a,1);
    handle_00 = (GLFWwindow *)(ulong)(uint)width;
    width_00 = height;
    handle = glfwCreateWindow(width,height,(this->_windowName)._M_dataplus._M_p,(GLFWmonitor *)0x0,
                              (GLFWwindow *)0x0);
    this->_window = handle;
    if (handle != (GLFWwindow *)0x0) {
      glfwSetWindowUserPointer(handle,this);
      glfwSetFramebufferSizeCallback(this->_window,_sizeCallback);
      glfwMakeContextCurrent(this->_window);
      gladLoadGL(glfwGetProcAddress);
      glfwSwapInterval((uint)this->vsyncEnabled);
      _reshapeFrustum(this,width,height);
      glfwGetFramebufferSize(this->_window,local_24,(int *)0x0);
      this->screenScale = (float)local_24[0] / (float)width;
      printf("screen scale detected: %f",(double)((float)local_24[0] / (float)width));
      putchar(10);
      fflush(_stdout);
      return;
    }
  }
  createWindow();
  this_00 = (Application *)glfwGetWindowUserPointer(handle_00);
  glfwGetWindowSize(this_00->_window,&this_00->_windowWidth,&this_00->_windowHeight);
  _reshapeFrustum(this_00,width_00,height_00);
  _reshapeOrtho(this_00,width_00,height_00);
  return;
}

Assistant:

void Application::createWindow(std::string windowName, int width, int height) {
    _windowName = windowName;
    _windowWidth = width;
    _windowHeight = height;

    if (!glfwInit()) {
        fprintf( stderr, "Failed to initialize GLFW\n" );
        exit( EXIT_FAILURE );
    }

    glfwWindowHint(GLFW_DEPTH_BITS, 16);
    glfwWindowHint(GLFW_TRANSPARENT_FRAMEBUFFER, GLFW_TRUE);

    _window = glfwCreateWindow(width, height, _windowName.c_str(), NULL, NULL);
    if (!_window) {
        fprintf(stderr, "Failed to open GLFW window\n");
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    // Set callback functions
    glfwSetWindowUserPointer(_window, this);
    glfwSetFramebufferSizeCallback(_window, _sizeCallback);

    // Lock to (probably) 60fps if vsyncEnabled, or unlock framerate
    glfwMakeContextCurrent(_window);
    gladLoadGL(glfwGetProcAddress);
    glfwSwapInterval(vsyncEnabled ? 1 : 0);

    // Setup the frame buffer and view port size
    _reshapeFrustum(width, height);
    //_reshapeOrtho(width, height); // Don't seem to need to set ortho size here...

    // Detect screen scale by comparing window size to framebuffer size
    int frameBufferWidth;
    glfwGetFramebufferSize(_window, &frameBufferWidth, NULL);
    screenScale = (float)frameBufferWidth / (float)width;
    DEBUG_PRINTLN("screen scale detected: %f", screenScale);
}